

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MainLoop.h
# Opt level: O3

int __thiscall MainLoop::Run(MainLoop *this)

{
  bool bVar1;
  function<bool_()> *this_00;
  function<bool_()> *local_18;
  
  this_00 = (function<bool_()> *)this;
  if ((__MainLoop__.super___shared_ptr<MainLoop,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
       (element_type *)0x0) && (Init(), this_00 = local_18, local_18 != (function<bool_()> *)0x0)) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_18);
    this_00 = local_18;
  }
  p_Begin((MainLoop *)this_00);
  while (onContinueCheck.super__Function_base._M_manager != (_Manager_type)0x0) {
    this_00 = &onContinueCheck;
    bVar1 = (*onContinueCheck._M_invoker)((_Any_data *)&onContinueCheck);
    if (!bVar1) break;
    this_00 = (function<bool_()> *)this;
    p_Update(this);
    p_Render((MainLoop *)this_00);
  }
  p_Teardown((MainLoop *)this_00);
  return 0;
}

Assistant:

int MainLoop::Run()
{
	if (__MainLoop__ == NULL)
		MainLoop::Init();
	p_Begin();
	while (p_CheckRunCondition())
	{
		p_Update();
		p_Render();
	}
	p_Teardown();
	return 0;
}